

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Data.cpp
# Opt level: O0

object get_int32_data(SRUP_MSG_DATA *self)

{
  int32_t *x;
  SRUP_MSG_DATA *in_RSI;
  int32_t *rv;
  SRUP_MSG_DATA *self_local;
  
  x = SRUP_MSG_DATA::data_int32(in_RSI);
  if (x == (int32_t *)0x0) {
    boost::python::api::object::object((object *)self);
  }
  else {
    boost::python::api::object::object<int>((object *)self,x);
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_int32_data(SRUP_MSG_DATA& self)
{
    int32_t* rv;
    rv = self.data_int32();

    if (rv != nullptr)
        return boost::python::object(*rv);
    else
        return boost::python::object();

}